

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall Minisat::IntOption::printOptions(IntOption *this,FILE *pcsFile,int granularity)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint *puVar5;
  uint uVar6;
  char *__format;
  long lVar7;
  ulong uVar8;
  vector<int,_std::allocator<int>_> values;
  char *pcVar9;
  vector<int,_std::allocator<int>_> local_48;
  
  pcVar4 = strstr((this->super_Option).name,"debug");
  if (((pcVar4 == (char *)0x0) &&
      (pcVar4 = strstr((this->super_Option).description,"debug"), pcVar4 == (char *)0x0)) &&
     (iVar3 = (*(this->super_Option)._vptr_Option[10])(this), (char)iVar3 != '\0')) {
    if (granularity == 0) {
      uVar6 = (this->range).begin;
      uVar1 = (this->range).end;
      if (uVar1 != 0x7fffffff && 0xffffffef < uVar6 - uVar1) {
LAB_001077bd:
        fprintf((FILE *)pcsFile,"%s  {%d",(this->super_Option).name);
        uVar6 = (this->range).begin;
        if ((int)uVar6 < (this->range).end) {
          do {
            uVar6 = uVar6 + 1;
            fprintf((FILE *)pcsFile,",%d",(ulong)uVar6);
          } while ((int)uVar6 < (this->range).end);
        }
        fprintf((FILE *)pcsFile,"} [%d]    # %s\n",(ulong)(uint)this->value,
                (this->super_Option).description);
        return;
      }
      if ((int)uVar1 < 0 || 0 < (int)uVar6) {
        uVar2 = this->value;
        pcVar4 = (this->super_Option).name;
        pcVar9 = (this->super_Option).description;
        __format = "%s  [%d,%d] [%d]il   # %s\n";
      }
      else {
        if (0xffffffef < uVar6 - uVar1) goto LAB_001077bd;
        uVar2 = this->value;
        pcVar4 = (this->super_Option).name;
        pcVar9 = (this->super_Option).description;
        __format = "%s  [%d,%d] [%d]i    # %s\n";
      }
      fprintf((FILE *)pcsFile,__format,pcVar4,(ulong)uVar6,(ulong)uVar1,(ulong)uVar2,pcVar9);
    }
    else {
      fprintf((FILE *)pcsFile,"%s  {",(this->super_Option).name);
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      fillGranularityDomain(this,granularity,&local_48);
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          puVar5 = (uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
          if (uVar8 != 0) {
            fputc(0x2c,(FILE *)pcsFile);
            puVar5 = (uint *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar7);
          }
          fprintf((FILE *)pcsFile,"%d",(ulong)*puVar5);
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 4;
        } while (uVar8 < (ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      fprintf((FILE *)pcsFile,"} [%d]    # %s\n",(ulong)(uint)this->value,
              (this->super_Option).description);
      if ((uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void printOptions(FILE *pcsFile, int granularity)
    {

        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print option?

        // print only, if there is a default
        // choose between logarithmic scale and linear scale based on the number of elements in the list - more than 16 elements means it should be log (simple heuristic)
        if (granularity != 0) {
            fprintf(pcsFile, "%s  {", name);
            std::vector<int> values;
            fillGranularityDomain(granularity, values);
            for (size_t i = 0; i < values.size(); ++i) {
                if (i != 0) {
                    fprintf(pcsFile, ",");
                }
                fprintf(pcsFile, "%d", values[i]);
            }
            fprintf(pcsFile, "} [%d]    # %s\n", value, description);
        } else {
            if ((range.end - range.begin <= 16 && range.end - range.begin > 0 && range.end != INT32_MAX) ||
                (range.begin <= 0 && range.end >= 0)) {
                if (range.end - range.begin <= 16 && range.end - range.begin > 0) { // print all values if the difference is really small
                    fprintf(pcsFile, "%s  {%d", name, range.begin);
                    for (int i = range.begin + 1; i <= range.end; ++i) {
                        fprintf(pcsFile, ",%d", i);
                    }
                    fprintf(pcsFile, "} [%d]    # %s\n", value, description);
                } else {
                    fprintf(pcsFile, "%s  [%d,%d] [%d]i    # %s\n", name, range.begin, range.end, value, description);
                }
            } else {
                fprintf(pcsFile, "%s  [%d,%d] [%d]il   # %s\n", name, range.begin, range.end, value, description);
            }
        }
    }